

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

string * __thiscall
yy::parser::yysyntax_error__abi_cxx11_(string *__return_storage_ptr__,parser *this,context *yyctx)

{
  symbol_kind_type *psVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar2;
  string local_80;
  char *local_60;
  char *yyp;
  ptrdiff_t yyi;
  char *local_48;
  char *yyformat;
  symbol_kind_type local_38;
  int yycount;
  symbol_kind_type yyarg [5];
  context *yyctx_local;
  parser *this_local;
  string *yyres;
  
  unique0x1000010a = yyctx;
  yyformat._4_4_ = yy_syntax_error_arguments_(this,yyctx,&local_38,5);
  switch(yyformat._4_4_) {
  default:
    local_48 = "syntax error";
    break;
  case 1:
    local_48 = "syntax error, unexpected %s";
    break;
  case 2:
    local_48 = "syntax error, unexpected %s, expecting %s";
    break;
  case 3:
    local_48 = "syntax error, unexpected %s, expecting %s or %s";
    break;
  case 4:
    local_48 = "syntax error, unexpected %s, expecting %s or %s or %s";
    break;
  case 5:
    local_48 = "syntax error, unexpected %s, expecting %s or %s or %s or %s";
  }
  yyi._7_1_ = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  yyp = (char *)0x0;
  uVar2 = extraout_RDX;
  for (local_60 = local_48; *local_60 != '\0'; local_60 = local_60 + 1) {
    if (((*local_60 == '%') && (local_60[1] == 's')) && ((long)yyp < (long)yyformat._4_4_)) {
      psVar1 = &local_38 + (long)yyp;
      yyp = yyp + 1;
      symbol_name_abi_cxx11_(&local_80,(parser *)(ulong)(uint)*psVar1,(symbol_kind_type)uVar2);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      local_60 = local_60 + 1;
      uVar2 = extraout_RDX_00;
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*local_60);
      uVar2 = extraout_RDX_01;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
  parser::yysyntax_error_ (const context& yyctx) const
  {
    // Its maximum.
    enum { YYARGS_MAX = 5 };
    // Arguments of yyformat.
    symbol_kind_type yyarg[YYARGS_MAX];
    int yycount = yy_syntax_error_arguments_ (yyctx, yyarg, YYARGS_MAX);

    char const* yyformat = YY_NULLPTR;
    switch (yycount)
      {
#define YYCASE_(N, S)                         \
        case N:                               \
          yyformat = S;                       \
        break
      default: // Avoid compiler warnings.
        YYCASE_ (0, YY_("syntax error"));
        YYCASE_ (1, YY_("syntax error, unexpected %s"));
        YYCASE_ (2, YY_("syntax error, unexpected %s, expecting %s"));
        YYCASE_ (3, YY_("syntax error, unexpected %s, expecting %s or %s"));
        YYCASE_ (4, YY_("syntax error, unexpected %s, expecting %s or %s or %s"));
        YYCASE_ (5, YY_("syntax error, unexpected %s, expecting %s or %s or %s or %s"));
#undef YYCASE_
      }

    std::string yyres;
    // Argument number.
    std::ptrdiff_t yyi = 0;
    for (char const* yyp = yyformat; *yyp; ++yyp)
      if (yyp[0] == '%' && yyp[1] == 's' && yyi < yycount)
        {
          yyres += symbol_name (yyarg[yyi++]);
          ++yyp;
        }
      else
        yyres += *yyp;
    return yyres;
  }